

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O3

Builder * __thiscall
arangodb::velocypack::Builder::closeEmptyArrayOrObject(Builder *this,ValueLength pos,bool isArray)

{
  ValueLength *pVVar1;
  pointer pCVar2;
  ValueLength VVar3;
  pointer puVar4;
  undefined7 in_register_00000011;
  
  this->_start[pos] = ((int)CONCAT71(in_register_00000011,isArray) == 0) * '\t' + '\x01';
  this->_pos = this->_pos - 8;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 - 8;
  pCVar2 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  VVar3 = pCVar2[-1].indexStartPos;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = pCVar2 + -1;
  puVar4 = (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + VVar3;
  if (puVar4 != (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  return this;
}

Assistant:

Builder& Builder::closeEmptyArrayOrObject(ValueLength pos, bool isArray) {
  // empty Array or Object
  _start[pos] = (isArray ? 0x01 : 0x0a);
  VELOCYPACK_ASSERT(_pos == pos + 9);
  rollback(8);  // no bytelength and number subvalues needed
  closeLevel();
  return *this;
}